

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_3D_K.H
# Opt level: O1

void amrex::mlndlap_bc_doit<int>
               (Box *vbx,Array4<int> *a,Box *domain,GpuArray<bool,_3U> *bflo,
               GpuArray<bool,_3U> *bfhi)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  undefined8 uVar12;
  char cVar13;
  int idim;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  int *piVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  Long LVar44;
  uint uVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  Box gdomain;
  undefined8 local_98;
  int local_90;
  int local_8c [2];
  undefined8 uStack_84;
  
  uVar12 = *(undefined8 *)((domain->smallend).vect + 2);
  local_8c[1] = (int)((ulong)*(undefined8 *)(domain->bigend).vect >> 0x20);
  uStack_84 = *(undefined8 *)((domain->bigend).vect + 2);
  local_98 = *(undefined8 *)(domain->smallend).vect;
  local_90 = (int)uVar12;
  local_8c[0] = (int)((ulong)uVar12 >> 0x20);
  lVar20 = 0;
  do {
    if (bflo->arr[lVar20] == false) {
      piVar10 = (int *)((long)&local_98 + lVar20 * 4);
      *piVar10 = *piVar10 + -1;
    }
    if (bfhi->arr[lVar20] == false) {
      local_8c[lVar20] = local_8c[lVar20] + 1;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  iVar6 = (vbx->smallend).vect[0];
  if (((((iVar6 <= (int)local_98) || ((vbx->smallend).vect[1] <= local_98._4_4_)) ||
       ((vbx->smallend).vect[2] <= local_90)) ||
      ((local_8c[0] <= (vbx->bigend).vect[0] || (local_8c[1] <= (vbx->bigend).vect[1])))) ||
     ((int)uStack_84 <= (vbx->bigend).vect[2])) {
    uVar15 = (domain->btype).itype;
    uVar27 = (vbx->smallend).vect[2] - 1;
    uVar35 = (vbx->bigend).vect[2] + 1;
    if ((int)uVar27 <= (int)uVar35) {
      uVar25 = (uint)(uVar15 != 0);
      iVar6 = iVar6 + -1;
      uVar22 = (vbx->smallend).vect[1] - 1;
      iVar7 = (vbx->bigend).vect[0];
      uVar23 = (vbx->bigend).vect[1] + 1;
      uVar36 = (domain->smallend).vect[1] - 1;
      uVar37 = (domain->smallend).vect[2] - 1;
      uVar32 = (domain->bigend).vect[1] + 1;
      uVar24 = (domain->bigend).vect[2] + 1;
      iVar14 = 2 - (uint)(uVar15 == 0);
      iVar8 = (domain->bigend).vect[0];
      iVar9 = (domain->smallend).vect[0];
      uVar15 = ~uVar25;
      iVar28 = -uVar25;
      do {
        if ((int)uVar22 <= (int)uVar23) {
          iVar16 = uVar15 + uVar27;
          iVar17 = iVar14 + uVar27;
          uVar26 = uVar27 ^ uVar37;
          uVar18 = uVar27 ^ uVar24;
          uVar25 = uVar22;
          do {
            if (iVar6 <= iVar7 + 1) {
              bVar47 = uVar27 == uVar24;
              bVar48 = uVar27 == uVar37;
              bVar46 = bflo->arr[0];
              bVar1 = bflo->arr[1];
              bVar2 = bflo->arr[2];
              bVar3 = bfhi->arr[1];
              bVar4 = bfhi->arr[2];
              bVar49 = uVar25 == uVar36;
              bVar50 = uVar25 == uVar32;
              piVar10 = a->p;
              lVar20 = a->jstride;
              lVar11 = a->kstride;
              iVar38 = uVar15 + uVar25;
              uVar29 = uVar25 ^ uVar36;
              uVar30 = uVar25 ^ uVar32;
              iVar31 = iVar14 + uVar25;
              bVar5 = bfhi->arr[0];
              iVar33 = iVar6;
              do {
                if ((((int)local_98 <= iVar33) && (local_98._4_4_ <= (int)uVar25)) &&
                   ((local_90 <= (int)uVar27 &&
                    (((iVar33 <= local_8c[0] && ((int)uVar25 <= local_8c[1])) &&
                     ((int)uVar27 <= (int)uStack_84)))))) goto LAB_006b2ad4;
                iVar42 = iVar33 - iVar9;
                if ((iVar42 == -1 && uVar29 == 0) && uVar26 == 0) {
                  if ((bVar46 & 1U) == 0) {
                    if (((bVar1 | bVar2) & 1U) != 0) {
                      if ((bVar46 & 1U) != 0) goto LAB_006b178e;
                      goto LAB_006b1da6;
                    }
                    goto LAB_006b16d2;
                  }
LAB_006b178e:
                  if (((bVar1 & 1U) != 0) && ((bVar2 & 1U) != 0)) {
                    iVar19 = iVar33 - (a->begin).x;
                    iVar42 = (a->begin).y;
                    iVar34 = (a->begin).z;
                    iVar40 = piVar10[(iVar31 - iVar42) * lVar20 +
                                     (long)(iVar19 + iVar14) + (iVar17 - iVar34) * lVar11];
                    piVar21 = piVar10 + (int)(uVar25 - iVar42) * lVar20 + (long)iVar19;
                    lVar41 = (int)(uVar27 - iVar34) * lVar11;
LAB_006b182c:
                    piVar21[lVar41] = iVar40;
                    goto LAB_006b2ad4;
                  }
                  if ((bVar46 & 1U) != 0) {
                    if ((bVar1 & 1U) != 0) {
                      iVar34 = iVar33 - (a->begin).x;
                      iVar42 = (a->begin).y;
                      lVar41 = ((long)(int)uVar27 - (long)(a->begin).z) * lVar11;
                      piVar10[(int)(uVar25 - iVar42) * lVar20 + iVar34 + lVar41] =
                           piVar10[(iVar31 - iVar42) * lVar20 + (iVar34 + iVar14) + lVar41];
                      goto LAB_006b2ad4;
                    }
                    if (((bVar46 & 1U) != 0) && ((bVar2 & 1U) != 0)) {
                      iVar34 = iVar33 - (a->begin).x;
                      lVar43 = ((long)(int)uVar25 - (long)(a->begin).y) * lVar20;
                      iVar42 = (a->begin).z;
                      iVar40 = piVar10[lVar43 + (long)(iVar34 + iVar14) + (iVar17 - iVar42) * lVar11
                                      ];
                      lVar41 = (int)(uVar27 - iVar42) * lVar11;
                      piVar21 = piVar10 + lVar43 + iVar34;
                      goto LAB_006b182c;
                    }
                  }
LAB_006b1da6:
                  if (((bVar1 & 1U) != 0) && ((bVar2 & 1U) != 0)) {
                    lVar41 = (long)(iVar33 - (a->begin).x);
                    iVar42 = (a->begin).y;
                    iVar34 = (a->begin).z;
                    piVar10[(int)(uVar25 - iVar42) * lVar20 +
                            lVar41 + (int)(uVar27 - iVar34) * lVar11] =
                         piVar10[(iVar31 - iVar42) * lVar20 + lVar41 + (iVar17 - iVar34) * lVar11];
                    goto LAB_006b2ad4;
                  }
                  if ((bVar46 & 1U) == 0) {
LAB_006b206c:
                    if ((bVar1 & 1U) != 0) {
                      lVar41 = (long)(iVar33 - (a->begin).x);
                      iVar42 = (a->begin).y;
                      lVar43 = ((long)(int)uVar27 - (long)(a->begin).z) * lVar11;
                      piVar10[(int)(uVar25 - iVar42) * lVar20 + lVar41 + lVar43] =
                           piVar10[(iVar31 - iVar42) * lVar20 + lVar41 + lVar43];
                      goto LAB_006b2ad4;
                    }
                    if ((bVar2 & 1U) == 0) goto LAB_006b2ad4;
                    iVar42 = (a->begin).z;
                    piVar21 = piVar10 + ((long)(int)uVar25 - (long)(a->begin).y) * lVar20 +
                                        (long)(iVar33 - (a->begin).x);
                    iVar34 = piVar21[(iVar17 - iVar42) * lVar11];
                    lVar41 = (int)(uVar27 - iVar42) * lVar11;
LAB_006b2667:
                    piVar21[lVar41] = iVar34;
                    goto LAB_006b2ad4;
                  }
                  iVar42 = iVar33 - (a->begin).x;
                  iVar34 = iVar42 + iVar14;
LAB_006b202b:
                  lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * lVar20;
                  lVar43 = ((long)(int)uVar27 - (long)(a->begin).z) * lVar11;
                  iVar34 = piVar10[lVar41 + iVar34 + lVar43];
                  lVar41 = lVar41 + iVar42;
LAB_006b2b80:
                  (piVar10 + lVar41)[lVar43] = iVar34;
                }
                else {
LAB_006b16d2:
                  uVar39 = iVar33 - iVar8;
                  uVar45 = uVar39 ^ 1;
                  if ((uVar45 == 0 && uVar29 == 0) && uVar26 == 0) {
                    if ((bVar5 & 1U) == 0) {
                      if (((bVar1 | bVar2) & 1U) != 0) {
                        if ((bVar5 & 1U) != 0) goto LAB_006b1840;
                        goto LAB_006b1f6f;
                      }
                      goto LAB_006b16f8;
                    }
LAB_006b1840:
                    if (((bVar1 & 1U) == 0) || ((bVar2 & 1U) == 0)) {
                      if ((bVar5 & 1U) == 0) {
LAB_006b1f6f:
                        if (((bVar1 & 1U) == 0) || ((bVar2 & 1U) == 0)) {
                          if ((bVar5 & 1U) == 0) goto LAB_006b206c;
                          iVar42 = iVar33 - (a->begin).x;
                          iVar34 = iVar42 + iVar28 + -1;
                          goto LAB_006b202b;
                        }
                        lVar41 = (long)(iVar33 - (a->begin).x);
                        iVar42 = (a->begin).y;
                        iVar34 = (a->begin).z;
                        piVar10[(int)(uVar25 - iVar42) * lVar20 +
                                lVar41 + (int)(uVar27 - iVar34) * lVar11] =
                             piVar10[(iVar31 - iVar42) * lVar20 +
                                     lVar41 + (iVar17 - iVar34) * lVar11];
                        goto LAB_006b2ad4;
                      }
                      if ((bVar1 & 1U) == 0) {
                        if (((bVar5 & 1U) != 0) && ((bVar2 & 1U) != 0)) {
                          iVar40 = iVar33 - (a->begin).x;
                          lVar43 = ((long)(int)uVar25 - (long)(a->begin).y) * lVar20;
                          iVar42 = (a->begin).z;
                          iVar34 = piVar10[lVar43 + (long)(iVar40 + iVar28 + -1) +
                                                    (iVar17 - iVar42) * lVar11];
                          lVar41 = (int)(uVar27 - iVar42) * lVar11;
                          piVar21 = piVar10 + lVar43 + iVar40;
                          goto LAB_006b18e0;
                        }
                        goto LAB_006b1f6f;
                      }
                      iVar40 = iVar33 - (a->begin).x;
                      iVar34 = (a->begin).y;
                      lVar41 = ((long)(int)uVar27 - (long)(a->begin).z) * lVar11;
                      iVar42 = piVar10[(iVar31 - iVar34) * lVar20 + (iVar40 + iVar28 + -1) + lVar41]
                      ;
                      piVar21 = piVar10 + (int)(uVar25 - iVar34) * lVar20;
LAB_006b1b3b:
                      piVar21[iVar40 + lVar41] = iVar42;
                      goto LAB_006b2ad4;
                    }
                    iVar19 = iVar33 - (a->begin).x;
                    iVar42 = (a->begin).y;
                    iVar40 = (a->begin).z;
                    iVar34 = piVar10[(iVar31 - iVar42) * lVar20 +
                                     (long)(iVar19 + iVar28 + -1) + (iVar17 - iVar40) * lVar11];
                    piVar21 = piVar10 + (int)(uVar25 - iVar42) * lVar20 + (long)iVar19;
                    lVar41 = (int)(uVar27 - iVar40) * lVar11;
LAB_006b18e0:
                    piVar21[lVar41] = iVar34;
                  }
                  else {
LAB_006b16f8:
                    if ((iVar42 != -1 || uVar30 != 0) || uVar26 != 0) {
LAB_006b170b:
                      if ((uVar45 == 0 && uVar30 == 0) && uVar26 == 0) {
                        if ((bVar5 & 1U) == 0) {
                          if (((bVar3 | bVar2) & 1U) != 0) {
                            if ((bVar5 & 1U) != 0) goto LAB_006b1a52;
                            goto LAB_006b24c6;
                          }
                          goto LAB_006b171c;
                        }
LAB_006b1a52:
                        if ((bfhi->arr[1] == true) && (bflo->arr[2] == true)) {
                          iVar19 = iVar33 - (a->begin).x;
                          iVar42 = (a->begin).y;
                          lVar41 = a->jstride;
                          LVar44 = a->kstride;
                          iVar34 = (a->begin).z;
                          lVar43 = (iVar38 - iVar42) * lVar41 + (long)(iVar28 + iVar19 + -1);
                          iVar40 = iVar17;
LAB_006b1cea:
                          piVar10[(int)(uVar25 - iVar42) * lVar41 +
                                  (long)iVar19 + (int)(uVar27 - iVar34) * LVar44] =
                               (piVar10 + lVar43)[(iVar40 - iVar34) * LVar44];
                          goto LAB_006b2ad4;
                        }
                        if ((bVar5 & 1U) != 0) {
                          if (bfhi->arr[1] != true) {
                            if (((bVar5 & 1U) == 0) || (bflo->arr[2] != true)) goto LAB_006b24c6;
                            iVar40 = iVar33 - (a->begin).x;
                            iVar19 = iVar28 + iVar40 + -1;
                            lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                            iVar42 = (a->begin).z;
                            iVar34 = iVar17;
LAB_006b26ca:
                            piVar10[lVar41 + (long)iVar40 +
                                             (long)(int)(uVar27 - iVar42) * a->kstride] =
                                 piVar10[lVar41 + (long)iVar19 +
                                                  (long)(iVar34 - iVar42) * a->kstride];
                            goto LAB_006b2ad4;
                          }
LAB_006b1c60:
                          iVar42 = iVar33 - (a->begin).x;
                          iVar34 = iVar28 + iVar42 + -1;
LAB_006b2a75:
                          iVar40 = (a->begin).y;
                          iVar19 = iVar38;
                          goto LAB_006b2a81;
                        }
LAB_006b24c6:
                        if ((bfhi->arr[1] == true) && (bflo->arr[2] == true)) {
                          iVar40 = (a->begin).x;
                          iVar42 = (a->begin).y;
                          lVar41 = a->jstride;
                          LVar44 = a->kstride;
                          lVar43 = (iVar38 - iVar42) * lVar41;
                          iVar34 = (a->begin).z;
                          iVar19 = iVar17;
LAB_006b2755:
                          iVar19 = piVar10[lVar43 + (long)(iVar33 - iVar40) +
                                                    (iVar19 - iVar34) * LVar44];
                          lVar43 = (int)(uVar27 - iVar34) * LVar44;
                          lVar41 = (int)(uVar25 - iVar42) * lVar41 + (long)(iVar33 - iVar40);
                          goto LAB_006b2797;
                        }
                        if ((bVar5 & 1U) != 0) {
LAB_006b251c:
                          iVar42 = iVar33 - (a->begin).x;
                          iVar34 = iVar28 + iVar42 + -1;
LAB_006b27bd:
                          lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                          lVar43 = ((long)(int)uVar27 - (long)(a->begin).z) * a->kstride;
                          piVar10[lVar41 + iVar42 + lVar43] = piVar10[lVar41 + iVar34 + lVar43];
                          goto LAB_006b2ad4;
                        }
                        if (bfhi->arr[1] == false) goto LAB_006b2543;
LAB_006b29b3:
                        iVar40 = (a->begin).x;
                        iVar42 = (a->begin).y;
                        iVar34 = iVar38;
                      }
                      else {
LAB_006b171c:
                        if ((iVar42 != -1 || uVar29 != 0) || uVar18 != 0) {
LAB_006b1727:
                          if ((uVar45 == 0 && uVar29 == 0) && uVar18 == 0) {
                            if ((bVar5 & 1U) == 0) {
                              if (((bVar1 | bVar4) & 1U) != 0) {
                                if ((bVar5 & 1U) != 0) goto LAB_006b1c84;
                                goto LAB_006b21a0;
                              }
                              goto LAB_006b1732;
                            }
LAB_006b1c84:
                            if ((bflo->arr[1] == true) && (bfhi->arr[2] == true)) {
                              iVar19 = iVar33 - (a->begin).x;
                              iVar40 = iVar28 + iVar19 + -1;
                              goto LAB_006b1cb6;
                            }
                            if ((bVar5 & 1U) == 0) {
LAB_006b21a0:
                              cVar13 = bflo->arr[1];
                              if (((bool)cVar13 == true) && (bfhi->arr[2] == true))
                              goto LAB_006b2725;
                              if ((bVar5 & 1U) != 0) goto LAB_006b251c;
                              goto LAB_006b2805;
                            }
                            if (bflo->arr[1] != true) {
                              if (((bVar5 & 1U) != 0) && (bfhi->arr[2] == true)) {
                                iVar40 = iVar33 - (a->begin).x;
                                iVar19 = iVar28 + iVar40 + -1;
                                goto LAB_006b26af;
                              }
                              goto LAB_006b21a0;
                            }
LAB_006b2a08:
                            iVar42 = iVar33 - (a->begin).x;
                            iVar34 = iVar28 + iVar42 + -1;
LAB_006b2a1c:
                            iVar40 = (a->begin).y;
                            iVar19 = iVar31;
LAB_006b2a81:
                            lVar41 = ((long)(int)uVar27 - (long)(a->begin).z) * a->kstride;
                            piVar10[(long)(int)(uVar25 - iVar40) * a->jstride + iVar42 + lVar41] =
                                 piVar10[(long)(iVar19 - iVar40) * a->jstride + iVar34 + lVar41];
                            goto LAB_006b2ad4;
                          }
LAB_006b1732:
                          if ((iVar42 == -1 && uVar30 == 0) && uVar18 == 0) {
                            if ((bVar46 & 1U) == 0) {
                              if (((bVar3 | bVar4) & 1U) != 0) {
                                if ((bVar46 & 1U) != 0) goto LAB_006b1ebc;
                                goto LAB_006b25bc;
                              }
                              goto LAB_006b1742;
                            }
LAB_006b1ebc:
                            if ((bfhi->arr[1] == true) && (bfhi->arr[2] == true)) {
                              iVar42 = iVar33 - (a->begin).x;
                              iVar34 = iVar14 + iVar42;
LAB_006b220b:
                              iVar40 = (a->begin).y;
                              iVar19 = (a->begin).z;
                              piVar10[(long)(int)(uVar25 - iVar40) * a->jstride +
                                      (long)iVar42 + (long)(int)(uVar27 - iVar19) * a->kstride] =
                                   piVar10[(long)(iVar38 - iVar40) * a->jstride +
                                           (long)iVar34 + (long)(iVar16 - iVar19) * a->kstride];
                              goto LAB_006b2ad4;
                            }
                            if ((bVar46 & 1U) != 0) {
                              if (bfhi->arr[1] != true) {
                                if (((bVar46 & 1U) == 0) || (bfhi->arr[2] != true))
                                goto LAB_006b25bc;
                                iVar42 = iVar33 - (a->begin).x;
                                iVar34 = iVar14 + iVar42;
LAB_006b2857:
                                lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                                iVar40 = (a->begin).z;
                                piVar10[lVar41 + (long)iVar42 +
                                                 (long)(int)(uVar27 - iVar40) * a->kstride] =
                                     piVar10[lVar41 + (long)iVar34 +
                                                      (long)(iVar16 - iVar40) * a->kstride];
                                goto LAB_006b2ad4;
                              }
LAB_006b2a63:
                              iVar42 = iVar33 - (a->begin).x;
                              iVar34 = iVar14 + iVar42;
                              goto LAB_006b2a75;
                            }
LAB_006b25bc:
                            cVar13 = bfhi->arr[1];
                            if (((bool)cVar13 == true) && (bfhi->arr[2] == true)) goto LAB_006b28cd;
                            if ((bVar46 & 1U) == 0) goto LAB_006b29ab;
LAB_006b25e5:
                            iVar42 = iVar33 - (a->begin).x;
                            iVar34 = iVar14 + iVar42;
LAB_006b2968:
                            lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                            lVar43 = ((long)(int)uVar27 - (long)(a->begin).z) * a->kstride;
                          }
                          else {
LAB_006b1742:
                            if ((uVar45 == 0 && uVar30 == 0) && uVar18 == 0) {
                              if ((bVar5 & 1U) == 0) {
                                if (((bVar3 | bVar4) & 1U) == 0) goto LAB_006b174c;
                                if ((bVar5 & 1U) != 0) goto LAB_006b21d9;
                              }
                              else {
LAB_006b21d9:
                                if ((bfhi->arr[1] == true) && (bfhi->arr[2] == true)) {
                                  iVar42 = iVar33 - (a->begin).x;
                                  iVar34 = iVar28 + iVar42 + -1;
                                  goto LAB_006b220b;
                                }
                                if ((bVar5 & 1U) != 0) {
                                  if (bfhi->arr[1] == true) goto LAB_006b1c60;
                                  if (((bVar5 & 1U) != 0) && (bfhi->arr[2] == true)) {
                                    iVar42 = iVar33 - (a->begin).x;
                                    iVar34 = iVar28 + iVar42 + -1;
                                    goto LAB_006b2857;
                                  }
                                }
                              }
                              cVar13 = bfhi->arr[1];
                              if (((bool)cVar13 == true) && (bfhi->arr[2] == true)) {
LAB_006b28cd:
                                lVar43 = (long)(iVar33 - (a->begin).x);
                                iVar42 = (a->begin).y;
                                iVar40 = (a->begin).z;
                                iVar34 = piVar10[(long)(iVar38 - iVar42) * a->jstride +
                                                 lVar43 + (long)(iVar16 - iVar40) * a->kstride];
                                lVar41 = (long)(int)(uVar27 - iVar40) * a->kstride;
                                piVar21 = piVar10 + (long)(int)(uVar25 - iVar42) * a->jstride +
                                                    lVar43;
                                goto LAB_006b18e0;
                              }
                              if ((bVar5 & 1U) == 0) {
LAB_006b29ab:
                                if (cVar13 != '\0') goto LAB_006b29b3;
                                goto LAB_006b2f95;
                              }
LAB_006b2953:
                              iVar42 = iVar33 - (a->begin).x;
                              iVar34 = iVar28 + iVar42 + -1;
                              goto LAB_006b2968;
                            }
LAB_006b174c:
                            if (iVar42 == -1 && uVar29 == 0) {
                              if ((bVar46 & 1U) == 0) {
                                if ((bVar1 & 1U) == 0) goto LAB_006b29e9;
                                if ((bVar46 & 1U) != 0) goto LAB_006b1764;
LAB_006b2b10:
                                if (bflo->arr[1] == true) goto LAB_006b2b1e;
                                goto LAB_006b2ad4;
                              }
LAB_006b1764:
                              if (bflo->arr[1] == true) goto LAB_006b1e9a;
                              if ((bVar46 & 1U) == 0) goto LAB_006b2b10;
LAB_006b2c4a:
                              iVar42 = iVar33 - (a->begin).x;
                              iVar34 = iVar14 + iVar42;
LAB_006b2c5c:
                              lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                              lVar43 = ((long)(int)uVar27 - (long)(a->begin).z) * a->kstride;
                              piVar10[lVar41 + iVar42 + lVar43] = piVar10[lVar41 + iVar34 + lVar43];
                              goto LAB_006b2ad4;
                            }
LAB_006b29e9:
                            if (uVar45 == 0 && uVar29 == 0) {
                              if ((bVar5 & 1U) == 0) {
                                if ((bVar1 & 1U) == 0) goto LAB_006b2a3e;
                                if ((bVar5 & 1U) == 0) goto LAB_006b2b10;
                              }
                              if (bflo->arr[1] == true) goto LAB_006b2a08;
                              if ((bVar5 & 1U) == 0) goto LAB_006b2b10;
                              iVar42 = iVar33 - (a->begin).x;
                              iVar34 = iVar28 + iVar42 + -1;
                              goto LAB_006b2c5c;
                            }
LAB_006b2a3e:
                            if (iVar42 == -1 && uVar30 == 0) {
                              if ((bVar46 & 1U) == 0) {
                                if ((bVar3 & 1U) == 0) goto LAB_006b2ba0;
                                if ((bVar46 & 1U) != 0) goto LAB_006b2a54;
                              }
                              else {
LAB_006b2a54:
                                if (bfhi->arr[1] == true) goto LAB_006b2a63;
                                if ((bVar46 & 1U) != 0) goto LAB_006b2c4a;
                              }
                              cVar13 = bfhi->arr[1];
joined_r0x006b2d02:
                              if (cVar13 != '\x01') goto LAB_006b2ad4;
                              goto LAB_006b29b3;
                            }
LAB_006b2ba0:
                            if (uVar45 == 0 && uVar30 == 0) {
                              if ((bVar5 & 1U) == 0) {
                                if ((bVar3 & 1U) == 0) goto LAB_006b2cb3;
                                if ((bVar5 & 1U) != 0) goto LAB_006b2bb9;
                              }
                              else {
LAB_006b2bb9:
                                if (bfhi->arr[1] == true) {
                                  iVar34 = iVar33 - (a->begin).x;
                                  iVar42 = (a->begin).y;
                                  lVar41 = ((long)(int)uVar27 - (long)(a->begin).z) * a->kstride;
                                  piVar10[(long)(int)(uVar25 - iVar42) * a->jstride +
                                          iVar34 + lVar41] =
                                       piVar10[(long)(iVar38 - iVar42) * a->jstride +
                                               (iVar28 + iVar34 + -1) + lVar41];
                                  goto LAB_006b2ad4;
                                }
                                if ((bVar5 & 1U) != 0) goto LAB_006b2953;
                              }
                              cVar13 = bfhi->arr[1];
                              goto joined_r0x006b2d02;
                            }
LAB_006b2cb3:
                            if ((iVar42 == -1) && (uVar27 == uVar37)) {
                              if ((bVar46 & 1U) == 0) {
                                if ((bVar2 & 1U) == 0) goto LAB_006b2d40;
                                if ((bVar46 & 1U) == 0) goto LAB_006b2543;
                              }
                              if (bflo->arr[2] == true) {
                                iVar42 = iVar33 - (a->begin).x;
                                iVar34 = iVar14 + iVar42;
LAB_006b2d7c:
                                lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                                iVar40 = (a->begin).z;
                                iVar19 = iVar17;
LAB_006b2e70:
                                piVar10[lVar41 + (long)iVar42 +
                                                 (long)(int)(uVar27 - iVar40) * a->kstride] =
                                     piVar10[lVar41 + (long)iVar34 +
                                                      (long)(iVar19 - iVar40) * a->kstride];
                                goto LAB_006b2ad4;
                              }
                              if ((bVar46 & 1U) != 0) goto LAB_006b25e5;
LAB_006b2543:
                              if (bflo->arr[2] != true) goto LAB_006b2ad4;
                              iVar34 = (a->begin).x;
                              lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                              iVar42 = (a->begin).z;
                              iVar40 = iVar17;
LAB_006b2fca:
                              iVar40 = iVar40 - iVar42;
                              LVar44 = a->kstride;
LAB_006b2fd4:
                              piVar10[lVar41 + (long)(iVar33 - iVar34) +
                                               (int)(uVar27 - iVar42) * LVar44] =
                                   piVar10[lVar41 + (long)(iVar33 - iVar34) + iVar40 * LVar44];
                              goto LAB_006b2ad4;
                            }
LAB_006b2d40:
                            if ((uVar39 == 1) && (uVar27 == uVar37)) {
                              if ((bVar5 & 1U) == 0) {
                                if ((bVar2 & 1U) == 0) goto LAB_006b2db0;
                                if ((bVar5 & 1U) == 0) goto LAB_006b2543;
                              }
                              if (bflo->arr[2] == true) {
                                iVar42 = iVar33 - (a->begin).x;
                                iVar34 = iVar28 + iVar42 + -1;
                                goto LAB_006b2d7c;
                              }
                              if ((bVar5 & 1U) != 0) goto LAB_006b2953;
                              goto LAB_006b2543;
                            }
LAB_006b2db0:
                            if ((iVar42 == -1) && (uVar27 == uVar24)) {
                              if ((bVar46 & 1U) == 0) {
                                if ((bVar4 & 1U) == 0) goto LAB_006b2e0e;
                                if ((bVar46 & 1U) == 0) goto LAB_006b2f95;
                              }
                              if (bfhi->arr[2] == true) {
                                iVar42 = iVar33 - (a->begin).x;
                                iVar34 = iVar14 + iVar42;
LAB_006b2e55:
                                lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                                iVar40 = (a->begin).z;
                                iVar19 = iVar16;
                                goto LAB_006b2e70;
                              }
                              if ((bVar46 & 1U) != 0) goto LAB_006b25e5;
LAB_006b2f95:
                              if (bfhi->arr[2] != true) goto LAB_006b2ad4;
LAB_006b2fa4:
                              iVar34 = (a->begin).x;
                              lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                              iVar42 = (a->begin).z;
                              iVar40 = iVar16;
                              goto LAB_006b2fca;
                            }
LAB_006b2e0e:
                            if ((uVar39 == 1) && (uVar27 == uVar24)) {
                              if ((bVar5 & 1U) == 0) {
                                if ((bVar4 & 1U) == 0) goto LAB_006b2ed7;
                                if ((bVar5 & 1U) == 0) goto LAB_006b2f95;
                              }
                              if (bfhi->arr[2] == true) {
                                iVar42 = iVar33 - (a->begin).x;
                                iVar34 = iVar28 + iVar42 + -1;
                                goto LAB_006b2e55;
                              }
                              if ((bVar5 & 1U) != 0) goto LAB_006b2953;
                              goto LAB_006b2f95;
                            }
LAB_006b2ed7:
                            if (bVar49 && bVar48) {
                              if ((bVar1 & 1U) == 0) {
                                if ((bVar2 & 1U) == 0) goto LAB_006b2f2e;
                                if ((bVar1 & 1U) == 0) goto LAB_006b2543;
                              }
                              if (bflo->arr[2] != true) {
                                if ((bVar1 & 1U) != 0) goto LAB_006b2b1e;
                                goto LAB_006b2543;
                              }
                              iVar34 = (a->begin).x;
                              iVar42 = (a->begin).y;
                              iVar40 = iVar31;
LAB_006b2f6a:
                              lVar43 = a->jstride;
                              LVar44 = a->kstride;
                              lVar41 = (iVar40 - iVar42) * lVar43;
                              iVar19 = (a->begin).z;
                              iVar40 = iVar17;
LAB_006b30d8:
                              iVar40 = piVar10[lVar41 + (long)(iVar33 - iVar34) +
                                                        (iVar40 - iVar19) * LVar44];
                              lVar41 = (int)(uVar27 - iVar19) * LVar44;
                              piVar21 = piVar10 + (int)(uVar25 - iVar42) * lVar43 +
                                                  (long)(iVar33 - iVar34);
                              goto LAB_006b182c;
                            }
LAB_006b2f2e:
                            if (bVar50 && bVar48) {
                              if ((bVar3 & 1U) == 0) {
                                if ((bVar2 & 1U) == 0) goto LAB_006b302b;
                                if ((bVar3 & 1U) == 0) goto LAB_006b2543;
                              }
                              if (bflo->arr[2] != true) {
                                if ((bVar3 & 1U) != 0) goto LAB_006b29b3;
                                goto LAB_006b2543;
                              }
                              iVar34 = (a->begin).x;
                              iVar42 = (a->begin).y;
                              iVar40 = iVar38;
                              goto LAB_006b2f6a;
                            }
LAB_006b302b:
                            if (bVar49 && bVar47) {
                              if ((bVar1 & 1U) == 0) {
                                if ((bVar4 & 1U) == 0) goto LAB_006b3085;
                                if ((bVar1 & 1U) == 0) goto LAB_006b2f95;
                              }
                              if (bfhi->arr[2] != true) {
                                if ((bVar1 & 1U) != 0) goto LAB_006b2b1e;
                                goto LAB_006b2f95;
                              }
                              iVar34 = (a->begin).x;
                              iVar42 = (a->begin).y;
                              iVar40 = iVar31;
LAB_006b30bd:
                              lVar43 = a->jstride;
                              LVar44 = a->kstride;
                              lVar41 = (iVar40 - iVar42) * lVar43;
                              iVar19 = (a->begin).z;
                              iVar40 = iVar16;
                              goto LAB_006b30d8;
                            }
LAB_006b3085:
                            if (bVar50 && bVar47) {
                              if ((bVar3 & 1U) == 0) {
                                if ((bVar4 & 1U) == 0) goto LAB_006b314b;
                                if ((bVar3 & 1U) != 0) goto LAB_006b309b;
                              }
                              else {
LAB_006b309b:
                                if ((bVar4 & 1U) != 0) {
                                  iVar34 = (a->begin).x;
                                  iVar42 = (a->begin).y;
                                  iVar40 = iVar38;
                                  goto LAB_006b30bd;
                                }
                                if ((bVar3 & 1U) != 0) goto LAB_006b29b3;
                              }
                              if ((bVar4 & 1U) == 0) goto LAB_006b2ad4;
                              goto LAB_006b2fa4;
                            }
LAB_006b314b:
                            if ((iVar42 != -1) || ((bVar46 & 1U) == 0)) {
                              if ((uVar39 == 1) && ((bVar5 & 1U) != 0)) {
                                iVar42 = iVar33 - (a->begin).x;
                                iVar34 = iVar28 + iVar42 + -1;
                                goto LAB_006b318f;
                              }
                              if ((bVar49 & bVar1) != 0) {
                                iVar34 = (a->begin).x;
                                iVar42 = (a->begin).y;
                                iVar40 = iVar31;
LAB_006b3212:
                                lVar41 = ((long)(int)uVar27 - (long)(a->begin).z) * lVar11;
                                piVar10[(int)(uVar25 - iVar42) * lVar20 + (iVar33 - iVar34) + lVar41
                                       ] = piVar10[(iVar40 - iVar42) * lVar20 +
                                                   (iVar33 - iVar34) + lVar41];
                                goto LAB_006b2ad4;
                              }
                              if ((bVar50 & bVar3) != 0) {
                                iVar34 = (a->begin).x;
                                iVar42 = (a->begin).y;
                                iVar40 = iVar38;
                                goto LAB_006b3212;
                              }
                              if ((bVar48 & bVar2) == 0) {
                                if ((bVar47 & bVar4) == 0) goto LAB_006b2ad4;
                                iVar34 = (a->begin).x;
                                lVar41 = (long)(int)uVar25 - (long)(a->begin).y;
                                iVar42 = (a->begin).z;
                                iVar40 = iVar16;
                              }
                              else {
                                iVar34 = (a->begin).x;
                                lVar41 = (long)(int)uVar25 - (long)(a->begin).y;
                                iVar42 = (a->begin).z;
                                iVar40 = iVar17;
                              }
                              lVar41 = lVar41 * lVar20;
                              iVar40 = iVar40 - iVar42;
                              LVar44 = lVar11;
                              goto LAB_006b2fd4;
                            }
                            iVar42 = iVar33 - (a->begin).x;
                            iVar34 = iVar14 + iVar42;
LAB_006b318f:
                            lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * lVar20;
                            lVar43 = ((long)(int)uVar27 - (long)(a->begin).z) * lVar11;
                          }
                          piVar10[lVar41 + iVar42 + lVar43] = piVar10[lVar41 + iVar34 + lVar43];
                          goto LAB_006b2ad4;
                        }
                        if ((bVar46 & 1U) == 0) {
                          if (((bVar1 | bVar4) & 1U) != 0) {
                            if ((bVar46 & 1U) != 0) goto LAB_006b1b6e;
                            goto LAB_006b270a;
                          }
                          goto LAB_006b1727;
                        }
LAB_006b1b6e:
                        if ((bflo->arr[1] == true) && (bfhi->arr[2] == true)) {
                          iVar19 = iVar33 - (a->begin).x;
                          iVar40 = iVar14 + iVar19;
LAB_006b1cb6:
                          iVar42 = (a->begin).y;
                          lVar41 = a->jstride;
                          LVar44 = a->kstride;
                          iVar34 = (a->begin).z;
                          lVar43 = (iVar31 - iVar42) * lVar41 + (long)iVar40;
                          iVar40 = iVar16;
                          goto LAB_006b1cea;
                        }
                        if ((bVar46 & 1U) != 0) {
                          if (bflo->arr[1] != true) {
                            if (((bVar46 & 1U) == 0) || (bfhi->arr[2] != true)) goto LAB_006b270a;
                            iVar40 = iVar33 - (a->begin).x;
                            iVar19 = iVar14 + iVar40;
LAB_006b26af:
                            lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                            iVar42 = (a->begin).z;
                            iVar34 = iVar16;
                            goto LAB_006b26ca;
                          }
LAB_006b1e9a:
                          iVar42 = iVar33 - (a->begin).x;
                          iVar34 = iVar14 + iVar42;
                          goto LAB_006b2a1c;
                        }
LAB_006b270a:
                        cVar13 = bflo->arr[1];
                        if (((bool)cVar13 == true) && (bfhi->arr[2] == true)) {
LAB_006b2725:
                          iVar40 = (a->begin).x;
                          iVar42 = (a->begin).y;
                          lVar41 = a->jstride;
                          LVar44 = a->kstride;
                          lVar43 = (iVar31 - iVar42) * lVar41;
                          iVar34 = (a->begin).z;
                          iVar19 = iVar16;
                          goto LAB_006b2755;
                        }
                        if ((bVar46 & 1U) != 0) {
                          iVar42 = iVar33 - (a->begin).x;
                          iVar34 = iVar14 + iVar42;
                          goto LAB_006b27bd;
                        }
LAB_006b2805:
                        if (cVar13 == '\0') goto LAB_006b2f95;
LAB_006b2b1e:
                        iVar40 = (a->begin).x;
                        iVar42 = (a->begin).y;
                        iVar34 = iVar31;
                      }
                      lVar43 = ((long)(int)uVar27 - (long)(a->begin).z) * a->kstride;
                      iVar34 = piVar10[(long)(iVar34 - iVar42) * a->jstride +
                                       (iVar33 - iVar40) + lVar43];
                      lVar41 = (long)(int)(uVar25 - iVar42) * a->jstride + (long)(iVar33 - iVar40);
                      goto LAB_006b2b80;
                    }
                    if ((bVar46 & 1U) == 0) {
                      if (((bVar3 | bVar2) & 1U) != 0) {
                        if ((bVar46 & 1U) != 0) goto LAB_006b190f;
                        goto LAB_006b2301;
                      }
                      goto LAB_006b170b;
                    }
LAB_006b190f:
                    if (((bVar3 & 1U) != 0) && ((bVar2 & 1U) != 0)) {
                      iVar40 = iVar33 - (a->begin).x;
                      iVar34 = (a->begin).y;
                      iVar19 = (a->begin).z;
                      iVar42 = a->p[(long)(iVar38 - iVar34) * a->jstride +
                                    (long)(iVar40 + iVar14) + (long)(iVar17 - iVar19) * a->kstride];
                      lVar41 = (long)(int)(uVar27 - iVar19) * a->kstride;
                      piVar21 = a->p + (long)(int)(uVar25 - iVar34) * a->jstride;
                      goto LAB_006b1b3b;
                    }
                    if ((bVar46 & 1U) == 0) {
LAB_006b2301:
                      if ((bfhi->arr[1] == true) && (bflo->arr[2] == true)) {
                        lVar41 = (long)(iVar33 - (a->begin).x);
                        iVar42 = (a->begin).y;
                        iVar34 = (a->begin).z;
                        piVar10[(long)(int)(uVar25 - iVar42) * a->jstride +
                                lVar41 + (long)(int)(uVar27 - iVar34) * a->kstride] =
                             piVar10[(long)(iVar38 - iVar42) * a->jstride +
                                     lVar41 + (long)(iVar17 - iVar34) * a->kstride];
                      }
                      else if ((bVar46 & 1U) == 0) {
                        if (bfhi->arr[1] == false) {
                          if (bflo->arr[2] == true) {
                            iVar42 = (a->begin).z;
                            piVar21 = piVar10 + ((long)(int)uVar25 - (long)(a->begin).y) *
                                                a->jstride + (long)(iVar33 - (a->begin).x);
                            iVar34 = piVar21[(long)(iVar17 - iVar42) * a->kstride];
                            lVar41 = (long)(int)(uVar27 - iVar42) * a->kstride;
                            goto LAB_006b2667;
                          }
                        }
                        else {
                          lVar41 = (long)(iVar33 - (a->begin).x);
                          iVar42 = (a->begin).y;
                          lVar43 = ((long)(int)uVar27 - (long)(a->begin).z) * a->kstride;
                          piVar10[(long)(int)(uVar25 - iVar42) * a->jstride + lVar41 + lVar43] =
                               piVar10[(long)(iVar38 - iVar42) * a->jstride + lVar41 + lVar43];
                        }
                      }
                      else {
                        iVar42 = iVar33 - (a->begin).x;
                        lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                        lVar43 = ((long)(int)uVar27 - (long)(a->begin).z) * a->kstride;
                        piVar10[lVar41 + iVar42 + lVar43] =
                             piVar10[lVar41 + (iVar42 + iVar14) + lVar43];
                      }
                      goto LAB_006b2ad4;
                    }
                    if (bfhi->arr[1] == true) {
                      iVar34 = iVar33 - (a->begin).x;
                      iVar42 = (a->begin).y;
                      lVar41 = ((long)(int)uVar27 - (long)(a->begin).z) * a->kstride;
                      a->p[(long)(int)(uVar25 - iVar42) * a->jstride + iVar34 + lVar41] =
                           a->p[(long)(iVar38 - iVar42) * a->jstride + (iVar34 + iVar14) + lVar41];
                      goto LAB_006b2ad4;
                    }
                    if (((bVar46 & 1U) == 0) || (bflo->arr[2] != true)) goto LAB_006b2301;
                    iVar34 = iVar33 - (a->begin).x;
                    lVar41 = ((long)(int)uVar25 - (long)(a->begin).y) * a->jstride;
                    iVar42 = (a->begin).z;
                    iVar19 = piVar10[lVar41 + (long)(iVar34 + iVar14) +
                                              (long)(iVar17 - iVar42) * a->kstride];
                    lVar43 = (long)(int)(uVar27 - iVar42) * a->kstride;
                    lVar41 = lVar41 + iVar34;
LAB_006b2797:
                    (piVar10 + lVar41)[lVar43] = iVar19;
                  }
                }
LAB_006b2ad4:
                iVar42 = iVar33 - iVar7;
                iVar33 = iVar33 + 1;
              } while (iVar42 != 1);
            }
            bVar46 = uVar25 != uVar23;
            uVar25 = uVar25 + 1;
          } while (bVar46);
        }
        bVar46 = uVar27 != uVar35;
        uVar27 = uVar27 + 1;
      } while (bVar46);
    }
  }
  return;
}

Assistant:

inline void mlndlap_bc_doit (Box const& vbx, Array4<T> const& a, Box const& domain,
                             GpuArray<bool,AMREX_SPACEDIM> const& bflo,
                             GpuArray<bool,AMREX_SPACEDIM> const& bfhi) noexcept
{
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (! bflo[idim]) gdomain.growLo(idim,1);
        if (! bfhi[idim]) gdomain.growHi(idim,1);
    }

    if (gdomain.strictly_contains(vbx)) return;

    const int offset = domain.cellCentered() ? 0 : 1;

    const auto dlo = amrex::lbound(domain);
    const auto dhi = amrex::ubound(domain);

    Box const& sbox = amrex::grow(vbx,1);
    AMREX_HOST_DEVICE_FOR_3D(sbox, i, j, k,
    {
        if (! gdomain.contains(IntVect(i,j,k))) {
            // xlo & ylo & zlo
            if (i == dlo.x-1 && j == dlo.y-1 && k == dlo.z-1 && (bflo[0] || bflo[1] || bflo[2]))
            {
                if (bflo[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k+1+offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & ylo & zlo
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dlo.z-1 && (bfhi[0] || bflo[1] || bflo[2]))
            {
                if (bfhi[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k+1+offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & yhi & zlo
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dlo.z-1 && (bflo[0] || bfhi[1] || bflo[2]))
            {
                if (bflo[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k+1+offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & yhi & zlo
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dlo.z-1 && (bfhi[0] || bfhi[1] || bflo[2]))
            {
                if (bfhi[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k+1+offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & ylo & zhi
            else if (i == dlo.x-1 && j == dlo.y-1 && k == dhi.z+1 && (bflo[0] || bflo[1] || bfhi[2]))
            {
                if (bflo[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k-1-offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & ylo & zhi
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dhi.z+1 && (bfhi[0] || bflo[1] || bfhi[2]))
            {
                if (bfhi[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k-1-offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & yhi & zhi
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dhi.z+1 && (bflo[0] || bfhi[1] || bfhi[2]))
            {
                if (bflo[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k-1-offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & yhi & zhi
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dhi.z+1 && (bfhi[0] || bfhi[1] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k-1-offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & ylo
            else if (i == dlo.x-1 && j == dlo.y-1 && (bflo[0] || bflo[1]))
            {
                if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xhi & ylo
            else if (i == dhi.x+1 && j == dlo.y-1 && (bfhi[0] || bflo[1]))
            {
                if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xlo & yhi
            else if (i == dlo.x-1 && j == dhi.y+1 && (bflo[0] || bfhi[1]))
            {
                if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xhi & yhi
            else if (i == dhi.x+1 && j == dhi.y+1 && (bfhi[0] || bfhi[1]))
            {
                if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xlo & zlo
            else if (i == dlo.x-1 && k == dlo.z-1 && (bflo[0] || bflo[2]))
            {
                if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & zlo
            else if (i == dhi.x+1 && k == dlo.z-1 && (bfhi[0] || bflo[2]))
            {
                if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & zhi
            else if (i == dlo.x-1 && k == dhi.z+1 && (bflo[0] || bfhi[2]))
            {
                if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & zhi
            else if (i == dhi.x+1 && k == dhi.z+1 && (bfhi[0] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // ylo & zlo
            else if (j == dlo.y-1 && k == dlo.z-1 && (bflo[1] || bflo[2]))
            {
                if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // yhi & zlo
            else if (j == dhi.y+1 && k == dlo.z-1 && (bfhi[1] || bflo[2]))
            {
                if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // ylo & zhi
            else if (j == dlo.y-1 && k == dhi.z+1 && (bflo[1] || bfhi[2]))
            {
                if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // yhi & zhi
            else if (j == dhi.y+1 && k == dhi.z+1 && (bfhi[1] || bfhi[2]))
            {
                if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            else if (i == dlo.x-1 && bflo[0])
            {
                a(i,j,k) = a(i+1+offset, j, k);
            }
            else if (i == dhi.x+1 && bfhi[0])
            {
                a(i,j,k) = a(i-1-offset, j, k);
            }
            else if (j == dlo.y-1 && bflo[1])
            {
                a(i,j,k) = a(i, j+1+offset, k);
            }
            else if (j == dhi.y+1 && bfhi[1])
            {
                a(i,j,k) = a(i, j-1-offset, k);
            }
            else if (k == dlo.z-1 && bflo[2])
            {
                a(i,j,k) = a(i, j, k+1+offset);
            }
            else if (k == dhi.z+1 && bfhi[2])
            {
                a(i,j,k) = a(i, j, k-1-offset);
            }
        }
    });
}